

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

ExprP<tcu::Matrix<float,_3,_3>_> __thiscall
vkt::shaderexecutor::VariableP::operator_cast_to_ExprP(VariableP *this)

{
  int *piVar1;
  long *plVar2;
  long *plVar3;
  undefined8 uVar4;
  SharedPtrStateBase *in_RDX;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  undefined8 *in_RSI;
  ExprP<tcu::Matrix<float,_3,_3>_> EVar5;
  
  plVar3 = (long *)in_RSI[1];
  if (plVar3 == (long *)0x0) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    uVar4 = *in_RSI;
    LOCK();
    *(int *)(plVar3 + 1) = (int)plVar3[1] + 1;
    UNLOCK();
    LOCK();
    *(int *)((long)plVar3 + 0xc) = *(int *)((long)plVar3 + 0xc) + 1;
    UNLOCK();
    *(undefined8 *)this = uVar4;
    *(long **)(this + 8) = plVar3;
    LOCK();
    *(int *)(plVar3 + 1) = (int)plVar3[1] + 1;
    UNLOCK();
    LOCK();
    *(int *)(*(long *)(this + 8) + 0xc) = *(int *)(*(long *)(this + 8) + 0xc) + 1;
    UNLOCK();
    piVar1 = (int *)((long)plVar3 + 0xc);
    LOCK();
    plVar2 = plVar3 + 1;
    *(int *)plVar2 = (int)*plVar2 + -1;
    UNLOCK();
    if ((int)*plVar2 == 0) {
      (**(code **)(*plVar3 + 0x10))(plVar3);
      in_RDX = extraout_RDX;
    }
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      (**(code **)(*plVar3 + 8))(plVar3);
      in_RDX = extraout_RDX_00;
    }
  }
  EVar5.super_ContainerExprPBase<tcu::Matrix<float,_3,_3>_>.
  super_ExprPBase<tcu::Matrix<float,_3,_3>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_3>_>_>.m_state = in_RDX;
  EVar5.super_ContainerExprPBase<tcu::Matrix<float,_3,_3>_>.
  super_ExprPBase<tcu::Matrix<float,_3,_3>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_3>_>_>.m_ptr =
       (Expr<tcu::Matrix<float,_3,_3>_> *)this;
  return (ExprP<tcu::Matrix<float,_3,_3>_>)
         EVar5.super_ContainerExprPBase<tcu::Matrix<float,_3,_3>_>.
         super_ExprPBase<tcu::Matrix<float,_3,_3>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_3>_>_>;
}

Assistant:

operator	ExprP<T>	(void) const { return exprP(SharedPtr<const Expr<T> >(*this)); }